

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void rf_draw_grid(int slices,float spacing)

{
  _Bool _Var1;
  int iVar2;
  undefined8 local_20;
  rf_int i;
  int half_slices;
  float spacing_local;
  int slices_local;
  
  iVar2 = slices / 2;
  _Var1 = rf_gfx_check_buffer_limit(slices << 2);
  if (_Var1) {
    rf_gfx_draw();
  }
  rf_gfx_begin(RF_LINES);
  for (local_20 = (long)-iVar2; local_20 <= iVar2; local_20 = local_20 + 1) {
    if (local_20 == 0) {
      rf_gfx_color3f(0.5,0.5,0.5);
      rf_gfx_color3f(0.5,0.5,0.5);
      rf_gfx_color3f(0.5,0.5,0.5);
      rf_gfx_color3f(0.5,0.5,0.5);
    }
    else {
      rf_gfx_color3f(0.75,0.75,0.75);
      rf_gfx_color3f(0.75,0.75,0.75);
      rf_gfx_color3f(0.75,0.75,0.75);
      rf_gfx_color3f(0.75,0.75,0.75);
    }
    rf_gfx_vertex3f((float)local_20 * spacing,0.0,(float)-iVar2 * spacing);
    rf_gfx_vertex3f((float)local_20 * spacing,0.0,(float)iVar2 * spacing);
    rf_gfx_vertex3f((float)-iVar2 * spacing,0.0,(float)local_20 * spacing);
    rf_gfx_vertex3f((float)iVar2 * spacing,0.0,(float)local_20 * spacing);
  }
  rf_gfx_end();
  return;
}

Assistant:

RF_API void rf_draw_grid(int slices, float spacing)
{
    int half_slices = slices/2;

    if (rf_gfx_check_buffer_limit(slices * 4)) rf_gfx_draw();

    rf_gfx_begin(RF_LINES);
    for (rf_int i = -half_slices; i <= half_slices; i++)
    {
        if (i == 0)
        {
            rf_gfx_color3f(0.5f, 0.5f, 0.5f);
            rf_gfx_color3f(0.5f, 0.5f, 0.5f);
            rf_gfx_color3f(0.5f, 0.5f, 0.5f);
            rf_gfx_color3f(0.5f, 0.5f, 0.5f);
        }
        else
        {
            rf_gfx_color3f(0.75f, 0.75f, 0.75f);
            rf_gfx_color3f(0.75f, 0.75f, 0.75f);
            rf_gfx_color3f(0.75f, 0.75f, 0.75f);
            rf_gfx_color3f(0.75f, 0.75f, 0.75f);
        }

        rf_gfx_vertex3f((float)i*spacing, 0.0f, (float)-half_slices*spacing);
        rf_gfx_vertex3f((float)i*spacing, 0.0f, (float)half_slices*spacing);

        rf_gfx_vertex3f((float)-half_slices*spacing, 0.0f, (float)i*spacing);
        rf_gfx_vertex3f((float)half_slices*spacing, 0.0f, (float)i*spacing);
    }
    rf_gfx_end();
}